

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-stb-truetype.h
# Opt level: O2

stbtt_uint32 stbtt__find_table(stbtt_uint8 *data,stbtt_uint32 fontstart,char *tag)

{
  stbtt_uint32 sVar1;
  ulong uVar2;
  uint uVar3;
  bool bVar4;
  
  uVar2 = (ulong)(ushort)(*(ushort *)(data + (ulong)fontstart + 4) << 8 |
                         *(ushort *)(data + (ulong)fontstart + 4) >> 8);
  uVar3 = fontstart + 0xc;
  while( true ) {
    bVar4 = uVar2 == 0;
    uVar2 = uVar2 - 1;
    if (bVar4) {
      return 0;
    }
    if (((((uint)data[uVar3] == (int)*tag) && ((uint)data[(ulong)uVar3 + 1] == (int)tag[1])) &&
        ((uint)data[(ulong)uVar3 + 2] == (int)tag[2])) &&
       ((uint)data[(ulong)uVar3 + 3] == (int)tag[3])) break;
    uVar3 = uVar3 + 0x10;
  }
  sVar1 = ttULONG(data + (ulong)uVar3 + 8);
  return sVar1;
}

Assistant:

static stbtt_uint32 stbtt__find_table(stbtt_uint8 *data, stbtt_uint32 fontstart, const char *tag)
{
   stbtt_int32 num_tables = ttUSHORT(data+fontstart+4);
   stbtt_uint32 tabledir = fontstart + 12;
   stbtt_int32 i;
   for (i=0; i < num_tables; ++i) {
      stbtt_uint32 loc = tabledir + 16*i;
      if (stbtt_tag(data+loc+0, tag))
         return ttULONG(data+loc+8);
   }
   return 0;
}